

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometricModel.h
# Opt level: O1

void __thiscall
csm::GeometricModel::Parameter::Parameter
          (Parameter *this,string *paramName,double paramValue,string *paramUnits,Type paramType,
          SharingCriteria *paramSharingCriteria)

{
  pointer pcVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined2 uVar8;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (paramName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + paramName->_M_string_length);
  this->value = paramValue;
  (this->units)._M_dataplus._M_p = (pointer)&(this->units).field_2;
  pcVar1 = (paramUnits->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->units,pcVar1,pcVar1 + paramUnits->_M_string_length);
  this->type = paramType;
  bVar3 = paramSharingCriteria->matchesSensorID;
  bVar4 = paramSharingCriteria->matchesPlatformID;
  bVar5 = paramSharingCriteria->matchesCollectionID;
  bVar6 = paramSharingCriteria->matchesTrajectoryID;
  bVar7 = paramSharingCriteria->matchesDateTime;
  uVar8 = *(undefined2 *)&paramSharingCriteria->field_0x6;
  dVar2 = paramSharingCriteria->maxTimeDelta;
  (this->sharingCriteria).matchesName = paramSharingCriteria->matchesName;
  (this->sharingCriteria).matchesSensorID = bVar3;
  (this->sharingCriteria).matchesPlatformID = bVar4;
  (this->sharingCriteria).matchesCollectionID = bVar5;
  (this->sharingCriteria).matchesTrajectoryID = bVar6;
  (this->sharingCriteria).matchesDateTime = bVar7;
  *(undefined2 *)&(this->sharingCriteria).field_0x6 = uVar8;
  (this->sharingCriteria).maxTimeDelta = dVar2;
  return;
}

Assistant:

Parameter(const std::string&      paramName,
                double                  paramValue,
                const std::string&      paramUnits,
                param::Type             paramType,
                const SharingCriteria&  paramSharingCriteria)
         :
            name            (paramName),
            value           (paramValue),
            units           (paramUnits),
            type            (paramType),
            sharingCriteria (paramSharingCriteria)
      {}